

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O2

int stbi_is_16_bit_from_file(FILE *f)

{
  int iVar1;
  long __off;
  stbi__context s;
  stbi__context sStack_f8;
  
  __off = ftell((FILE *)f);
  stbi__start_file(&sStack_f8,f);
  iVar1 = stbi__is_16_main(&sStack_f8);
  fseek((FILE *)f,__off,0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_16_bit_from_file(FILE *f)
{
   int r;
   stbi__context s;
   long pos = ftell(f);
   stbi__start_file(&s, f);
   r = stbi__is_16_main(&s);
   fseek(f,pos,SEEK_SET);
   return r;
}